

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O3

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::exportImportFunction
          (ModuleSplitter *this,Name funcName)

{
  char **__return_storage_ptr__;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *this_00;
  Config *pCVar1;
  IString *this_01;
  char *pcVar2;
  Name name;
  Name name_00;
  undefined1 auVar3 [8];
  size_t type;
  iterator iVar4;
  long *plVar5;
  Export *pEVar6;
  string_view *psVar7;
  Function *pFVar8;
  Module *pMVar9;
  long *plVar10;
  string_view s;
  string_view s_00;
  Name root;
  string_view sVar11;
  Name name_01;
  long *local_c0 [2];
  long local_b0 [2];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *local_a0;
  ModuleSplitter *local_98;
  pointer puStack_90;
  undefined1 auStack_88 [8];
  Name funcName_local;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  long local_68;
  long lStack_60;
  undefined1 auStack_58 [8];
  __single_object export_;
  code *local_48;
  code *pcStack_40;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  auStack_88 = funcName.super_IString.str._M_len;
  this_00 = &this->exportedPrimaryFuncs;
  iVar4 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find(&this_00->_M_t,(key_type *)auStack_88);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header) {
    pCVar1 = this->config;
    local_a0 = this_00;
    if (pCVar1->minimizeNewExportNames == true) {
      local_98 = (ModuleSplitter *)&this->minified;
      do {
        pCVar1 = this->config;
        __return_storage_ptr__ = &funcName_local.super_IString.str._M_str;
        Names::MinifiedNameGenerator::getName_abi_cxx11_
                  ((string *)__return_storage_ptr__,(MinifiedNameGenerator *)local_98);
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)__return_storage_ptr__,0,(char *)0x0,
                                    (ulong)(pCVar1->newExportPrefix)._M_dataplus._M_p);
        pMVar9 = (Module *)(plVar5 + 2);
        if ((Module *)*plVar5 == pMVar9) {
          local_48 = (code *)(pMVar9->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          pcStack_40 = (code *)plVar5[3];
          auStack_58 = (undefined1  [8])&stack0xffffffffffffffb8;
        }
        else {
          local_48 = (code *)(pMVar9->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          auStack_58 = (undefined1  [8])*plVar5;
        }
        export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
             *(__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
              &((__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> *)(plVar5 + 1))->
               _M_t;
        *plVar5 = (long)pMVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        s._M_str = (char *)0x0;
        s._M_len = (size_t)auStack_58;
        sVar11 = IString::interned((IString *)
                                   export_._M_t.
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,s,
                                   SUB81(pMVar9,0));
        if (auStack_58 != (undefined1  [8])&stack0xffffffffffffffb8) {
          operator_delete((void *)auStack_58,
                          (ulong)((long)&(((pointer)local_48)->_M_t).
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                 + 1));
        }
        if ((long *)funcName_local.super_IString.str._M_str != &local_68) {
          operator_delete(funcName_local.super_IString.str._M_str,local_68 + 1);
        }
        pEVar6 = Module::getExportOrNull(this->primary,(Name)sVar11);
      } while (pEVar6 != (Export *)0x0);
    }
    else {
      pMVar9 = this->primary;
      local_c0[0] = local_b0;
      local_98 = this;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,funcName_local.super_IString.str._M_len,
                 (long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                           *)auStack_88)->
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>).
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
                 funcName_local.super_IString.str._M_len);
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_c0,0,(char *)0x0,
                                  (ulong)(pCVar1->newExportPrefix)._M_dataplus._M_p);
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_68 = *plVar10;
        lStack_60 = plVar5[3];
        funcName_local.super_IString.str._M_str = (char *)&local_68;
      }
      else {
        local_68 = *plVar10;
        funcName_local.super_IString.str._M_str = (char *)*plVar5;
      }
      this_01 = (IString *)plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      s_00._M_str = (char *)0x0;
      s_00._M_len = (size_t)funcName_local.super_IString.str._M_str;
      sVar11 = IString::interned(this_01,s_00,SUB81(plVar10,0));
      export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
           (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x0;
      pcStack_40 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:64:23)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:64:23)>
                 ::_M_manager;
      root.super_IString.str._M_str = (char *)auStack_58;
      root.super_IString.str._M_len = (size_t)sVar11._M_str;
      auStack_58 = (undefined1  [8])pMVar9;
      sVar11 = (string_view)
               Names::getValidName((Names *)sVar11._M_len,root,
                                   (function<bool_(wasm::Name)> *)auStack_58);
      if ((pointer)local_48 != (pointer)0x0) {
        (*local_48)(auStack_58,auStack_58,3);
      }
      if ((long *)funcName_local.super_IString.str._M_str != &local_68) {
        operator_delete(funcName_local.super_IString.str._M_str,local_68 + 1);
      }
      this = local_98;
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
        this = local_98;
      }
    }
    pMVar9 = this->primary;
    local_98 = (ModuleSplitter *)auStack_88;
    puStack_90 = (pointer)funcName_local.super_IString.str._M_len;
    auStack_58 = (undefined1  [8])operator_new(0x28);
    (((Module *)auStack_58)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Module *)auStack_58)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar11._M_len;
    (((Module *)auStack_58)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar11._M_str;
    (((Module *)auStack_58)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98;
    (((Module *)auStack_58)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puStack_90;
    Module::addExport(pMVar9,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                             auStack_58);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,0x28);
    }
    psVar7 = (string_view *)
             std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[](local_a0,(key_type *)auStack_88);
    *psVar7 = sVar11;
  }
  else {
    sVar11._M_len = (size_t)iVar4._M_node[1]._M_left;
    sVar11._M_str = (char *)iVar4._M_node[1]._M_right;
  }
  name.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)auStack_88;
  pFVar8 = Module::getFunctionOrNull(this->secondary,name);
  type = funcName_local.super_IString.str._M_len;
  auVar3 = auStack_88;
  if (pFVar8 == (Function *)0x0) {
    name_00.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)auStack_88;
    pFVar8 = Module::getFunction(this->primary,name_00);
    auStack_58 = (undefined1  [8])0x0;
    export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x0;
    local_48 = (code *)0x0;
    name_01.super_IString.str._M_str = (char *)auVar3;
    name_01.super_IString.str._M_len = (size_t)&funcName_local.super_IString.str._M_str;
    Builder::makeFunction
              (name_01,(HeapType)type,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar8->type).id,
               (Expression *)auStack_58);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,(long)local_48 - (long)auStack_58);
    }
    pcVar2 = (this->config->importNamespace).super_IString.str._M_str;
    *(size_t *)(funcName_local.super_IString.str._M_str + 0x18) =
         (this->config->importNamespace).super_IString.str._M_len;
    *(char **)(funcName_local.super_IString.str._M_str + 0x20) = pcVar2;
    *(string_view *)(funcName_local.super_IString.str._M_str + 0x28) = sVar11;
    Module::addFunction(this->secondary,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &funcName_local.super_IString.str._M_str);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &funcName_local.super_IString.str._M_str);
  }
  return;
}

Assistant:

void ModuleSplitter::exportImportFunction(Name funcName) {
  Name exportName;
  // If the function is already exported, use the existing export name.
  // Otherwise, create a new export for it.
  auto exportIt = exportedPrimaryFuncs.find(funcName);
  if (exportIt != exportedPrimaryFuncs.end()) {
    exportName = exportIt->second;
  } else {
    if (config.minimizeNewExportNames) {
      do {
        exportName = config.newExportPrefix + minified.getName();
      } while (primary.getExportOrNull(exportName) != nullptr);
    } else {
      exportName = Names::getValidExportName(
        primary, config.newExportPrefix + funcName.toString());
    }
    primary.addExport(
      Builder::makeExport(exportName, funcName, ExternalKind::Function));
    exportedPrimaryFuncs[funcName] = exportName;
  }
  // Import the function if it is not already imported into the secondary
  // module.
  if (secondary.getFunctionOrNull(funcName) == nullptr) {
    auto func =
      Builder::makeFunction(funcName, primary.getFunction(funcName)->type, {});
    func->module = config.importNamespace;
    func->base = exportName;
    secondary.addFunction(std::move(func));
  }
}